

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.h
# Opt level: O2

void __thiscall xmrig::HttpData::HttpData(HttpData *this,uint64_t id)

{
  _Rb_tree_header *p_Var1;
  
  this->method = 0;
  this->status = 0;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->headers)._M_t._M_impl.super__Rb_tree_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->body)._M_dataplus._M_p = (pointer)&(this->body).field_2;
  (this->body)._M_string_length = 0;
  (this->body).field_2._M_local_buf[0] = '\0';
  (this->url)._M_dataplus._M_p = (pointer)&(this->url).field_2;
  (this->url)._M_string_length = 0;
  (this->url).field_2._M_local_buf[0] = '\0';
  this->m_id = id;
  return;
}

Assistant:

inline HttpData(uint64_t id) : method(0), status(0), m_id(id) {}